

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O0

tnt_reply * tnt_reply_init(tnt_reply *r)

{
  tnt_reply *ptStack_18;
  int alloc;
  tnt_reply *r_local;
  
  ptStack_18 = r;
  if (((r == (tnt_reply *)0x0) == 0) ||
     (ptStack_18 = (tnt_reply *)tnt_mem_alloc(0x78), ptStack_18 != (tnt_reply *)0x0)) {
    memset(ptStack_18,0,0x78);
    ptStack_18->alloc = (uint)(r == (tnt_reply *)0x0);
    r_local = ptStack_18;
  }
  else {
    r_local = (tnt_reply *)0x0;
  }
  return r_local;
}

Assistant:

struct tnt_reply *tnt_reply_init(struct tnt_reply *r) {
	int alloc = (r == NULL);
	if (alloc) {
		r = tnt_mem_alloc(sizeof(struct tnt_reply));
		if (!r) return NULL;
	}
	memset(r, 0, sizeof(struct tnt_reply));
	r->alloc = alloc;
	return r;
}